

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O2

double crnlib::image_utils::compute_block_ssim(uint t,uint8 *pX,uint8 *pY)

{
  uint i;
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  undefined1 auVar4 [16];
  double dVar5;
  undefined1 auVar6 [16];
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar7;
  
  uVar2 = (ulong)t;
  auVar6 = ZEXT816(0);
  for (uVar1 = 0; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    dVar9 = auVar6._8_8_;
    auVar6._0_8_ = auVar6._0_8_ + (double)pY[uVar1];
    auVar6._8_8_ = dVar9 + (double)pX[uVar1];
  }
  auVar4._0_8_ = (double)uVar2;
  auVar4._8_8_ = auVar4._0_8_;
  auVar6 = divpd(auVar6,auVar4);
  dVar7 = auVar6._8_8_;
  dVar8 = 0.0;
  dVar9 = 0.0;
  for (uVar1 = 0; dVar5 = auVar6._0_8_, uVar2 != uVar1; uVar1 = uVar1 + 1) {
    dVar8 = dVar8 + ((double)pY[uVar1] - dVar5) * ((double)pY[uVar1] - dVar5);
    dVar9 = dVar9 + ((double)pX[uVar1] - dVar7) * ((double)pX[uVar1] - dVar7);
  }
  dVar10 = (double)(t - 1);
  dVar9 = dVar9 / dVar10;
  if (dVar9 < 0.0) {
    dVar9 = sqrt(dVar9);
  }
  else {
    dVar9 = SQRT(dVar9);
  }
  dVar8 = dVar8 / dVar10;
  if (dVar8 < 0.0) {
    dVar8 = sqrt(dVar8);
  }
  else {
    dVar8 = SQRT(dVar8);
  }
  dVar3 = 0.0;
  for (uVar1 = 0; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    dVar3 = dVar3 + ((double)pY[uVar1] - dVar5) * ((double)pX[uVar1] - dVar7);
  }
  return ((dVar3 / dVar10 + dVar3 / dVar10 + 58.5225) * ((dVar7 + dVar7) * dVar5 + 6.5025)) /
         ((dVar9 * dVar9 + dVar8 * dVar8 + 58.5225) * (dVar7 * dVar7 + dVar5 * dVar5 + 6.5025));
}

Assistant:

double compute_block_ssim(uint t, const uint8* pX, const uint8* pY)
        {
            double ave_x = 0.0f;
            double ave_y = 0.0f;
            for (uint i = 0; i < t; i++)
            {
                ave_x += pX[i];
                ave_y += pY[i];
            }

            ave_x /= t;
            ave_y /= t;

            double var_x = 0.0f;
            double var_y = 0.0f;
            for (uint i = 0; i < t; i++)
            {
                var_x += math::square(pX[i] - ave_x);
                var_y += math::square(pY[i] - ave_y);
            }

            var_x = sqrt(var_x / (t - 1));
            var_y = sqrt(var_y / (t - 1));

            double covar_xy = 0.0f;
            for (uint i = 0; i < t; i++)
            {
                covar_xy += (pX[i] - ave_x) * (pY[i] - ave_y);
            }

            covar_xy /= (t - 1);

            const double c1 = 6.5025; //(255*.01)^2
            const double c2 = 58.5225; //(255*.03)^2

            double n = (2.0f * ave_x * ave_y + c1) * (2.0f * covar_xy + c2);
            double d = (ave_x * ave_x + ave_y * ave_y + c1) * (var_x * var_x + var_y * var_y + c2);

            return n / d;
        }